

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O3

void __thiscall PInt::PInt(PInt *this,uint size,bool unsign,bool compatible)

{
  DObject *pDVar1;
  undefined7 in_register_00000011;
  uint uVar2;
  
  PBasicType::PBasicType((PBasicType *)this,size,size);
  *(undefined ***)this = &PTR_StaticType_006f3190;
  this->Unsigned = unsign;
  this->IntCompatible = compatible;
  FString::Format((FString *)&this->field_0x60,"%cInt%d",
                  (ulong)((int)CONCAT71(in_register_00000011,unsign) * 2 + 0x53),size);
  this->field_0x58 = size < 4;
  if (unsign) {
    pDVar1 = (DObject *)
             M_Malloc_Dbg(0x38,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                          ,0x1f9);
    DObject::DObject(pDVar1);
    *(undefined4 *)&pDVar1->field_0x24 = 0x264;
    pDVar1[1]._vptr_DObject = (_func_int **)this;
    pDVar1->_vptr_DObject = (_func_int **)&PTR_StaticType_006f47b0;
    *(undefined4 *)&pDVar1[1].Class = 0;
    PSymbolTable::AddSymbol((PSymbolTable *)&this->field_0x38,(PSymbol *)pDVar1);
    pDVar1 = (DObject *)
             M_Malloc_Dbg(0x38,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                          ,0x1f9);
    DObject::DObject(pDVar1);
    *(undefined4 *)&pDVar1->field_0x24 = 0x265;
    pDVar1[1]._vptr_DObject = (_func_int **)this;
    pDVar1->_vptr_DObject = (_func_int **)&PTR_StaticType_006f47b0;
    *(int *)&pDVar1[1].Class = ~(-1 << ((byte)(size << 3) & 0x1f));
    PSymbolTable::AddSymbol((PSymbolTable *)&this->field_0x38,(PSymbol *)pDVar1);
  }
  else {
    uVar2 = -1 << ((char)(size << 3) - 1U & 0x1f);
    pDVar1 = (DObject *)
             M_Malloc_Dbg(0x38,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                          ,0x1f9);
    DObject::DObject(pDVar1);
    *(undefined4 *)&pDVar1->field_0x24 = 0x264;
    pDVar1[1]._vptr_DObject = (_func_int **)this;
    pDVar1->_vptr_DObject = (_func_int **)&PTR_StaticType_006f47b0;
    *(uint *)&pDVar1[1].Class = uVar2;
    PSymbolTable::AddSymbol((PSymbolTable *)&this->field_0x38,(PSymbol *)pDVar1);
    pDVar1 = (DObject *)
             M_Malloc_Dbg(0x38,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                          ,0x1f9);
    DObject::DObject(pDVar1);
    *(undefined4 *)&pDVar1->field_0x24 = 0x265;
    pDVar1[1]._vptr_DObject = (_func_int **)this;
    pDVar1->_vptr_DObject = (_func_int **)&PTR_StaticType_006f47b0;
    *(uint *)&pDVar1[1].Class = ~uVar2;
    PSymbolTable::AddSymbol((PSymbolTable *)&this->field_0x38,(PSymbol *)pDVar1);
  }
  SetOps(this);
  return;
}

Assistant:

PInt::PInt(unsigned int size, bool unsign, bool compatible)
: PBasicType(size, size), Unsigned(unsign), IntCompatible(compatible)
{
	mDescriptiveName.Format("%cInt%d", unsign? 'U':'S', size);

	MemberOnly = (size < 4);
	if (!unsign)
	{
		int maxval = (1 << ((8 * size) - 1)) - 1;
		int minval = -maxval - 1;
		Symbols.AddSymbol(new PSymbolConstNumeric(NAME_Min, this, minval));
		Symbols.AddSymbol(new PSymbolConstNumeric(NAME_Max, this, maxval));
	}
	else
	{
		Symbols.AddSymbol(new PSymbolConstNumeric(NAME_Min, this, 0u));
		Symbols.AddSymbol(new PSymbolConstNumeric(NAME_Max, this, (1u << (8 * size)) - 1));
	}
	SetOps();
}